

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_abs<signed_char>(uint length)

{
  ulong uVar1;
  undefined1 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  long lVar5;
  undefined1 *puVar6;
  shared_ptr<signed_char> pv;
  
  uVar1 = (ulong)length;
  puVar2 = (undefined1 *)operator_new__((long)(int)length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<signed_char*,void(*)(signed_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv,puVar2,
             nosimd::common::free<signed_char>);
  if (0 < (int)length) {
    lVar5 = 0;
    puVar6 = puVar2;
    do {
      *puVar6 = (char)lVar5;
      lVar5 = lVar5 + -1;
      puVar6 = puVar6 + 1;
    } while (-lVar5 != uVar1);
  }
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      if ((char)puVar2[uVar4] < '\0') {
        puVar2[uVar4] = -puVar2[uVar4];
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      if (0x80 < (byte)puVar2[uVar4]) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = "void test_abs(unsigned int) [T = signed char]";
        *(undefined4 *)(puVar3 + 1) = 0x81;
        *(uint *)((long)puVar3 + 0xc) = length;
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (pv.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}